

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerSession.cpp
# Opt level: O0

void __thiscall ki::protocol::net::ServerSession::on_connected(ServerSession *this)

{
  rep rVar1;
  undefined1 local_68 [8];
  SessionOffer offer;
  duration<long,_std::ratio<1L,_1000L>_> local_48;
  long local_40;
  long milliseconds;
  duration<long,_std::ratio<1L,_1L>_> local_30;
  rep local_28;
  rep timestamp;
  time_point now;
  ServerSession *this_local;
  
  now.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  *(duration *)(&this->field_0x18 + (long)this->_vptr_ServerSession[-3]) = now.__d.__r;
  timestamp = std::chrono::_V2::system_clock::now();
  milliseconds = (long)std::chrono::
                       time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                       ::time_since_epoch((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                           *)&timestamp);
  local_30.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                                ((duration<long,_std::ratio<1L,_1000000000L>_> *)&milliseconds);
  local_28 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_30);
  offer._16_8_ = std::chrono::
                 time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                 ::time_since_epoch((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                     *)&timestamp);
  local_48.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                                ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                                 &offer.m_milliseconds);
  rVar1 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_48);
  local_40 = rVar1 + local_28 * -1000;
  control::SessionOffer::SessionOffer
            ((SessionOffer *)local_68,
             *(uint16_t *)(&this->field_0x8 + (long)this->_vptr_ServerSession[-3]),(int32_t)local_28
             ,(uint32_t)local_40);
  Session::send_packet
            ((Session *)((long)&this->_vptr_ServerSession + (long)this->_vptr_ServerSession[-3]),
             true,'\0',(Serializable *)local_68);
  control::SessionOffer::~SessionOffer((SessionOffer *)local_68);
  return;
}

Assistant:

void ServerSession::on_connected()
	{
		m_connection_time = std::chrono::steady_clock::now();

		// Work out the current timestamp and how many milliseconds 
		// have elapsed in the current second. 
		auto now = std::chrono::system_clock::now();
		const auto timestamp = std::chrono::duration_cast<std::chrono::seconds>(
			now.time_since_epoch()
		).count();
		const auto milliseconds = std::chrono::duration_cast<std::chrono::milliseconds>(
			now.time_since_epoch()
		).count() - (timestamp * 1000);

		// Send a SESSION_OFFER packet to the client 
		const control::SessionOffer offer(m_id, timestamp, milliseconds);
		send_packet(true, (uint8_t)control::Opcode::SESSION_OFFER, offer);
	}